

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraInd.c
# Opt level: O0

void Fra_FraigInductionRewrite(Fra_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  Aig_Man_t *p_00;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  abctime aVar8;
  abctime clk;
  int local_30;
  int i;
  int k;
  int nTruePis;
  Aig_Obj_t *pObjPo;
  Aig_Obj_t *pObj;
  Aig_Man_t *pTemp;
  Fra_Man_t *p_local;
  
  aVar5 = Abc_Clock();
  p_00 = Dar_ManRewriteDefault(p->pManFraig);
  if (p->pManFraig->nRegs != p_00->nRegs) {
    __assert_fail("p->pManFraig->nRegs == pTemp->nRegs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraInd.c"
                  ,0x3f,"void Fra_FraigInductionRewrite(Fra_Man_t *)");
  }
  if (p->pManFraig->nAsserts != p_00->nAsserts) {
    __assert_fail("p->pManFraig->nAsserts == pTemp->nAsserts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraInd.c"
                  ,0x40,"void Fra_FraigInductionRewrite(Fra_Man_t *)");
  }
  iVar1 = Aig_ManCiNum(p->pManAig);
  iVar2 = Aig_ManRegNum(p->pManAig);
  memset(p->pMemFraig,0,(long)p->nSizeAlloc * 8 * (long)p->nFramesAll);
  pAVar6 = Aig_ManConst1(p->pManAig);
  iVar3 = p->pPars->nFramesK;
  pAVar7 = Aig_ManConst1(p_00);
  Fra_ObjSetFraig(pAVar6,iVar3,pAVar7);
  clk._4_4_ = 0;
  while( true ) {
    iVar3 = Aig_ManCiNum(p->pManAig);
    iVar4 = Aig_ManRegNum(p->pManAig);
    if (iVar3 - iVar4 <= clk._4_4_) break;
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->pManAig->vCis,clk._4_4_);
    iVar3 = p->pPars->nFramesK;
    pAVar7 = Aig_ManCi(p_00,(iVar1 - iVar2) * p->pPars->nFramesK + clk._4_4_);
    Fra_ObjSetFraig(pAVar6,iVar3,pAVar7);
    clk._4_4_ = clk._4_4_ + 1;
  }
  local_30 = 0;
  iVar3 = Aig_ManRegNum(p->pManAig);
  iVar1 = Aig_ManCoNum(p_00);
  if (iVar3 != iVar1 - p_00->nAsserts) {
    __assert_fail("Aig_ManRegNum(p->pManAig) == Aig_ManCoNum(pTemp) - pTemp->nAsserts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraInd.c"
                  ,0x47,"void Fra_FraigInductionRewrite(Fra_Man_t *)");
  }
  iVar3 = Aig_ManCiNum(p->pManAig);
  iVar1 = Aig_ManRegNum(p->pManAig);
  for (clk._4_4_ = iVar3 - iVar1; iVar3 = Vec_PtrSize(p->pManAig->vCis), clk._4_4_ < iVar3;
      clk._4_4_ = clk._4_4_ + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->pManAig->vCis,clk._4_4_);
    pAVar7 = Aig_ManCo(p_00,p_00->nAsserts + local_30);
    iVar3 = p->pPars->nFramesK;
    pAVar7 = Aig_ObjChild0(pAVar7);
    Fra_ObjSetFraig(pAVar6,iVar3,pAVar7);
    local_30 = local_30 + 1;
  }
  Aig_ManStop(p->pManFraig);
  p->pManFraig = p_00;
  aVar8 = Abc_Clock();
  p->timeRwr = (aVar8 - aVar5) + p->timeRwr;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs AIG rewriting on the constraint manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Fra_FraigInductionRewrite( Fra_Man_t * p )
{
    Aig_Man_t * pTemp;
    Aig_Obj_t * pObj, * pObjPo;
    int nTruePis, k, i;
    abctime clk = Abc_Clock();
    // perform AIG rewriting on the speculated frames
//    pTemp = Dar_ManRwsat( pTemp, 1, 0 );
    pTemp = Dar_ManRewriteDefault( p->pManFraig );
//    printf( "Before = %6d.  After = %6d.\n", Aig_ManNodeNum(p->pManFraig), Aig_ManNodeNum(pTemp) ); 
//Aig_ManDumpBlif( p->pManFraig, "1.blif", NULL, NULL );
//Aig_ManDumpBlif( pTemp, "2.blif", NULL, NULL );
//    Fra_FramesWriteCone( pTemp );
//    Aig_ManStop( pTemp );
    // transfer PI/register pointers
    assert( p->pManFraig->nRegs == pTemp->nRegs );
    assert( p->pManFraig->nAsserts == pTemp->nAsserts );
    nTruePis = Aig_ManCiNum(p->pManAig) - Aig_ManRegNum(p->pManAig);
    memset( p->pMemFraig, 0, sizeof(Aig_Obj_t *) * p->nSizeAlloc * p->nFramesAll );
    Fra_ObjSetFraig( Aig_ManConst1(p->pManAig), p->pPars->nFramesK, Aig_ManConst1(pTemp) );
    Aig_ManForEachPiSeq( p->pManAig, pObj, i )
        Fra_ObjSetFraig( pObj, p->pPars->nFramesK, Aig_ManCi(pTemp,nTruePis*p->pPars->nFramesK+i) );
    k = 0;
    assert( Aig_ManRegNum(p->pManAig) == Aig_ManCoNum(pTemp) - pTemp->nAsserts );
    Aig_ManForEachLoSeq( p->pManAig, pObj, i )
    {
        pObjPo = Aig_ManCo(pTemp, pTemp->nAsserts + k++);
        Fra_ObjSetFraig( pObj, p->pPars->nFramesK, Aig_ObjChild0(pObjPo) );
    }
    // exchange
    Aig_ManStop( p->pManFraig );
    p->pManFraig = pTemp;
p->timeRwr += Abc_Clock() - clk;
}